

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTPNCodeBodyBase::fold_constants(CTPNCodeBodyBase *this,CTcPrsSymtab *param_1)

{
  CTPNStm *pCVar1;
  
  pCVar1 = this->stm_;
  if (pCVar1 != (CTPNStm *)0x0) {
    (*(pCVar1->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xf])
              (pCVar1,this->lcltab_);
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNCodeBodyBase::fold_constants(class CTcPrsSymtab *)
{
    /* 
     *   fold constants in our compound statement, in the scope of our
     *   local symbol table 
     */
    if (stm_ != 0)
        stm_->fold_constants(lcltab_);

    /* we are not directly changed by this operation */
    return this;
}